

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunnerTest.cpp
# Opt level: O0

void __thiscall
TEST_CommandLineTestRunner_veryVerboseSetOnOutput_Test::testBody
          (TEST_CommandLineTestRunner_veryVerboseSetOnOutput_Test *this)

{
  UtestShell *pUVar1;
  SimpleString *pSVar2;
  char *pcVar3;
  undefined1 local_60 [8];
  CommandLineTestRunnerWithStringBufferOutput commandLineTestRunner;
  char *argv [2];
  TEST_CommandLineTestRunner_veryVerboseSetOnOutput_Test *this_local;
  
  commandLineTestRunner.fakeTCOutputWhichIsReallyABuffer =
       (StringBufferTestOutput *)anon_var_dwarf_66e4;
  CommandLineTestRunnerWithStringBufferOutput::CommandLineTestRunnerWithStringBufferOutput
            ((CommandLineTestRunnerWithStringBufferOutput *)local_60,2,
             (char **)&commandLineTestRunner.fakeTCOutputWhichIsReallyABuffer,
             &(this->super_TEST_GROUP_CppUTestGroupCommandLineTestRunner).registry);
  CommandLineTestRunner::runAllTestsMain((CommandLineTestRunner *)local_60);
  pUVar1 = UtestShell::getCurrent();
  pSVar2 = StringBufferTestOutput::getOutput
                     (commandLineTestRunner.fakeJUnitOutputWhichIsReallyABuffer_);
  pcVar3 = SimpleString::asCharString(pSVar2);
  (*pUVar1->_vptr_UtestShell[0xc])
            (pUVar1,"TEST(group1, test1)",pcVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineTestRunnerTest.cpp"
             ,0xdb);
  pUVar1 = UtestShell::getCurrent();
  pSVar2 = StringBufferTestOutput::getOutput
                     (commandLineTestRunner.fakeJUnitOutputWhichIsReallyABuffer_);
  pcVar3 = SimpleString::asCharString(pSVar2);
  (*pUVar1->_vptr_UtestShell[0xc])
            (pUVar1,"destroyTest",pcVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineTestRunnerTest.cpp"
             ,0xdc);
  CommandLineTestRunnerWithStringBufferOutput::~CommandLineTestRunnerWithStringBufferOutput
            ((CommandLineTestRunnerWithStringBufferOutput *)local_60);
  return;
}

Assistant:

TEST(CommandLineTestRunner, veryVerboseSetOnOutput)
{
    const char* argv[] = { "tests.exe", "-vv"};

    CommandLineTestRunnerWithStringBufferOutput commandLineTestRunner(2, argv, &registry);
    commandLineTestRunner.runAllTestsMain();
    STRCMP_CONTAINS("TEST(group1, test1)", commandLineTestRunner.fakeConsoleOutputWhichIsReallyABuffer->getOutput().asCharString());
    STRCMP_CONTAINS("destroyTest", commandLineTestRunner.fakeConsoleOutputWhichIsReallyABuffer->getOutput().asCharString());
}